

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

int lys_set_enabled(lys_module *module)

{
  byte *pbVar1;
  uint16_t *puVar2;
  lys_module **pplVar3;
  lys_node **pplVar4;
  lys_module *node;
  lys_node *plVar5;
  long lVar6;
  int iVar7;
  LYS_NODE LVar8;
  ly_set *mods;
  ly_set *set;
  long lVar9;
  ly_set *set_00;
  lys_node *leafref;
  lys_node *plVar10;
  lys_node *plVar11;
  char *format;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ly_ctx *ctx;
  lys_ident *der;
  char *pcVar15;
  lys_node *plVar16;
  bool bVar17;
  uint local_34 [2];
  uint s;
  
  if (module == (lys_module *)0x0) {
    format = "Invalid arguments (%s()).";
    pcVar15 = "lys_set_enabled";
    ctx = (ly_ctx *)0x0;
  }
  else {
    if ((module->field_0x40 & 0x40) == 0) {
      return 0;
    }
    ctx = module->ctx;
    uVar13 = 0;
    do {
      if (ctx->internal_module_count == uVar13) {
        mods = ly_set_new();
        set = ly_set_new();
        lys_set_enabled_(mods,module);
        goto LAB_0010cd41;
      }
      pplVar3 = (ctx->models).list + uVar13;
      uVar13 = uVar13 + 1;
    } while (*pplVar3 != module);
    pcVar15 = module->name;
    format = "Internal module \"%s\" cannot be removed.";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,format,pcVar15);
  return 1;
LAB_0010cd41:
  uVar13 = (ulong)ctx->internal_module_count;
LAB_0010cd49:
  if ((long)uVar13 < (long)(ctx->models).used) {
    node = (ctx->models).list[uVar13];
    if (((node->field_0x40 & 0x40) != 0) && (iVar7 = ly_set_contains(set,node), iVar7 == -1)) {
      lVar9 = 0;
      do {
        if ((ulong)node->imp_size * 0x38 + 0x38 == lVar9 + 0x38) {
          uVar12 = 0;
          goto LAB_0010cda8;
        }
        lVar6 = lVar9 + -0x10;
        lVar9 = lVar9 + 0x38;
      } while ((*(byte *)(*(long *)(node->imp->rev + lVar6) + 0x40) & 0x40) == 0);
    }
    goto LAB_0010cda1;
  }
  uVar13 = 0;
  goto LAB_0010ce3a;
LAB_0010cda8:
  if (uVar12 == node->imp_size) goto LAB_0010cddd;
  uVar14 = 0;
  do {
    if (mods->number == uVar14) goto LAB_0010cdd8;
    pplVar4 = (mods->set).s + uVar14;
    uVar14 = uVar14 + 1;
  } while (node->imp[uVar12].module != (lys_module *)*pplVar4);
  node->field_0x40 = node->field_0x40 & 0xbf;
  ly_set_add(mods,node,0);
  lVar9 = 0;
  for (uVar13 = 0; uVar13 < node->inc_size; uVar13 = uVar13 + 1) {
    pbVar1 = (byte *)(*(long *)(node->inc->rev + lVar9 + -8) + 0x40);
    *pbVar1 = *pbVar1 & 0xbf;
    lVar9 = lVar9 + 0x30;
  }
  goto LAB_0010cd41;
LAB_0010cddd:
  ly_set_add(set,node,0);
LAB_0010cda1:
  uVar13 = uVar13 + 1;
  goto LAB_0010cd49;
LAB_0010cdd8:
  uVar12 = uVar12 + 1;
  goto LAB_0010cda8;
LAB_0010ce3a:
  uVar12 = (ulong)mods->number;
  if (uVar12 <= uVar13) {
    for (uVar13 = 0; uVar13 < uVar12; uVar13 = uVar13 + 1) {
      if ((((lys_module *)(mods->set).s[uVar13])->field_0x40 & 0x80) != 0) {
        lys_sub_module_apply_devs_augs((lys_module *)(mods->set).s[uVar13]);
        uVar12 = (ulong)mods->number;
      }
    }
    ly_set_free(mods);
    ly_set_free(set);
    puVar2 = &(ctx->models).module_set_id;
    *puVar2 = *puVar2 + 1;
    return 0;
  }
  plVar5 = (mods->set).s[uVar13];
  if (((ulong)plVar5->parent & 0x80) != 0) {
    for (uVar12 = 0; uVar12 < *(ushort *)&plVar5->child; uVar12 = uVar12 + 1) {
      uVar14 = 0;
      while( true ) {
        if ((byte)plVar5[1].dsc[uVar12 * 0x48 + 0x1f] <= uVar14) break;
        der = (lys_ident *)(plVar5[1].dsc + uVar12 * 0x48);
        resolve_identity_backlink_update(der,der->base[uVar14]);
        uVar14 = uVar14 + 1;
      }
    }
  }
  for (uVar12 = 0; uVar12 < *(byte *)((long)&plVar5->child + 4); uVar12 = uVar12 + 1) {
    lVar9 = uVar12 * 0x40;
    for (uVar14 = 0; uVar14 < (byte)plVar5[1].ref[lVar9 + 0x1b]; uVar14 = uVar14 + 1) {
      resolve_iffeature_getsizes
                ((lys_iffeature *)(*(long *)(plVar5[1].ref + lVar9 + 0x28) + uVar14 * 0x20),
                 (uint *)0x0,local_34);
      while (bVar17 = local_34[0] != 0, local_34[0] = local_34[0] - 1, bVar17) {
        pcVar15 = plVar5[1].ref;
        lVar6 = *(long *)(*(long *)(*(long *)(pcVar15 + lVar9 + 0x28) + 0x10 + uVar14 * 0x20) +
                         (ulong)local_34[0] * 8);
        set_00 = *(ly_set **)(lVar6 + 0x38);
        if (set_00 == (ly_set *)0x0) {
          set_00 = ly_set_new();
          *(ly_set **)(lVar6 + 0x38) = set_00;
          pcVar15 = plVar5[1].ref;
        }
        ly_set_add(set_00,pcVar15 + lVar9,1);
      }
    }
  }
  plVar16 = *(lys_node **)&plVar5[1].nodetype;
LAB_0010cf18:
  leafref = plVar16;
  if (leafref != (lys_node *)0x0) {
    LVar8 = leafref->nodetype;
    if (LVar8 != LYS_GROUPING) {
      if (((LVar8 & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) && (*(int *)&leafref[1].ref == 9)) {
        lys_leaf_add_leafref_target(*(lys_node_leaf **)&leafref[1].nodetype,leafref);
        LVar8 = leafref->nodetype;
      }
      plVar16 = leafref->child;
      if (plVar16 != (lys_node *)0x0 && (LVar8 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN
         ) goto LAB_0010cf7c;
    }
    if (leafref == *(lys_node **)&plVar5[1].nodetype) goto LAB_0010cfb5;
    do {
      plVar16 = leafref->next;
LAB_0010cf7c:
      if (plVar16 != (lys_node *)0x0) break;
      leafref = lys_parent(leafref);
      plVar10 = lys_parent(leafref);
      plVar11 = lys_parent(*(lys_node **)&plVar5[1].nodetype);
    } while (plVar10 != plVar11);
    goto LAB_0010cf18;
  }
LAB_0010cfb5:
  uVar13 = uVar13 + 1;
  goto LAB_0010ce3a;
}

Assistant:

API int
lys_set_enabled(const struct lys_module *module)
{
    struct ly_ctx *ctx; /* shortcut */
    struct lys_module *mod;
    struct ly_set *mods, *disabled;
    int i;
    unsigned int u, v, w;

    if (!module) {
        LOGARG;
        return EXIT_FAILURE;
    } else if (!module->disabled) {
        /* already enabled module */
        return EXIT_SUCCESS;
    }
    mod = (struct lys_module *)module;
    ctx = mod->ctx;

    /* avoid disabling internal modules */
    for (i = 0; i < ctx->internal_module_count; i++) {
        if (mod == ctx->models.list[i]) {
            LOGERR(ctx, LY_EINVAL, "Internal module \"%s\" cannot be removed.", mod->name);
            return EXIT_FAILURE;
        }
    }

    mods = ly_set_new();
    disabled = ly_set_new();

    /* enable the module, including its dependencies */
    lys_set_enabled_(mods, mod);

    /* we will go through the all disabled modules in the context, if the module has no dependency (import)
     * that is still disabled AND at least one of its imported module is from the set we are enabling now,
     * it is going to be also enabled. This way we try to revert everething that was possibly done by
     * lys_set_disabled(). */
checkdependency:
    for (i = ctx->internal_module_count; i < ctx->models.used; i++) {
        mod = ctx->models.list[i]; /* shortcut */
        if (!mod->disabled || ly_set_contains(disabled, mod) != -1) {
            /* skip the enabled modules */
            continue;
        }

        /* check imported modules */
        for (u = 0; u < mod->imp_size; u++) {
            if (mod->imp[u].module->disabled) {
                /* it has disabled dependency so it must stay disabled */
                break;
            }
        }
        if (u < mod->imp_size) {
            /* it has disabled dependency, continue with the next module in the context */
            continue;
        }

        /* get know if at least one of the imported modules is being enabled this time */
        for (u = 0; u < mod->imp_size; u++) {
            for (v = 0; v < mods->number; v++) {
                if (mod->imp[u].module == mods->set.g[v]) {
                    /* yes, it is, so they are connected and we are going to enable it as well,
                     * it is not necessary to call recursive lys_set_enable_() because we already
                     * know that there is no disabled import to enable */
                    mod->disabled = 0;
                    ly_set_add(mods, mod, 0);
                    for (w = 0; w < mod->inc_size; w++) {
                        mod->inc[w].submodule->disabled = 0;
                    }
                    /* we have to start again because some of the already checked modules can
                     * depend on the one we have just decided to enable */
                    goto checkdependency;
                }
            }
        }

        /* this module is disabled, but it does not depend on any other disabled module and none
         * of its imports was not enabled in this call. No future enabling of the disabled module
         * will change this so we can remember the module and skip it next time we will have to go
         * through the all context because of the checkdependency goto.
         */
        ly_set_add(disabled, mod, 0);
    }

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    ctx_modules_redo_backlinks(mods);

    /* re-apply the deviations and augments */
    for (v = 0; v < mods->number; v++) {
        if (((struct lys_module *)mods->set.g[v])->implemented) {
            lys_sub_module_apply_devs_augs((struct lys_module *)mods->set.g[v]);
        }
    }

    /* free the sets */
    ly_set_free(mods);
    ly_set_free(disabled);

    /* update the module-set-id */
    ctx->models.module_set_id++;

    return EXIT_SUCCESS;
}